

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd.hpp
# Opt level: O2

void duckdb::alp::AlpRDDecompression<double>::Decompress
               (uint8_t *left_encoded,uint8_t *right_encoded,uint16_t *left_parts_dict,
               EXACT_TYPE *output,idx_t values_count,uint16_t exceptions_count,uint16_t *exceptions,
               uint16_t *exceptions_positions,uint8_t left_bit_width,uint8_t right_bit_width)

{
  ulong uVar1;
  idx_t i;
  idx_t iVar2;
  uint8_t left_decoded [8192];
  ulong local_4038 [1024];
  ushort local_2038 [4100];
  
  switchD_014c3389::default(local_2038,0,0x2000);
  switchD_014c3389::default(local_4038,0,0x2000);
  BitpackingPrimitives::UnPackBuffer<unsigned_short>
            ((data_ptr_t)local_2038,left_encoded,values_count,left_bit_width,false);
  BitpackingPrimitives::UnPackBuffer<unsigned_long>
            ((data_ptr_t)local_4038,right_encoded,values_count,right_bit_width,false);
  for (iVar2 = 0; values_count != iVar2; iVar2 = iVar2 + 1) {
    output[iVar2] =
         (ulong)left_parts_dict[local_2038[iVar2]] << (right_bit_width & 0x3f) | local_4038[iVar2];
  }
  for (uVar1 = 0; exceptions_count != uVar1; uVar1 = uVar1 + 1) {
    output[exceptions_positions[uVar1]] =
         (ulong)exceptions[uVar1] << (right_bit_width & 0x3f) |
         local_4038[exceptions_positions[uVar1]];
  }
  return;
}

Assistant:

static void Decompress(uint8_t *left_encoded, uint8_t *right_encoded, const uint16_t *left_parts_dict,
	                       EXACT_TYPE *output, idx_t values_count, uint16_t exceptions_count,
	                       const uint16_t *exceptions, const uint16_t *exceptions_positions, uint8_t left_bit_width,
	                       uint8_t right_bit_width) {

		uint8_t left_decoded[AlpRDConstants::ALP_VECTOR_SIZE * 8] = {0};
		uint8_t right_decoded[AlpRDConstants::ALP_VECTOR_SIZE * 8] = {0};

		// Bitunpacking left and right parts
		BitpackingPrimitives::UnPackBuffer<uint16_t>(left_decoded, left_encoded, values_count, left_bit_width);
		BitpackingPrimitives::UnPackBuffer<EXACT_TYPE>(right_decoded, right_encoded, values_count, right_bit_width);

		uint16_t *left_parts = reinterpret_cast<uint16_t *>(data_ptr_cast(left_decoded));
		EXACT_TYPE *right_parts = reinterpret_cast<EXACT_TYPE *>(data_ptr_cast(right_decoded));

		// Decoding
		for (idx_t i = 0; i < values_count; i++) {
			uint16_t left = left_parts_dict[left_parts[i]];
			EXACT_TYPE right = right_parts[i];
			output[i] = (static_cast<EXACT_TYPE>(left) << right_bit_width) | right;
		}

		// Exceptions Patching (exceptions only occur in left parts)
		for (idx_t i = 0; i < exceptions_count; i++) {
			EXACT_TYPE right = right_parts[exceptions_positions[i]];
			uint16_t left = exceptions[i];
			output[exceptions_positions[i]] = (static_cast<EXACT_TYPE>(left) << right_bit_width) | right;
		}
	}